

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall OpenMD::EAM::calcForce(EAM *this,InteractionData *idat)

{
  RealType *t;
  bool bVar1;
  byte bVar2;
  pointer piVar3;
  RealType RVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pEVar7;
  InteractionData *pIVar8;
  EAMMixingMethod EVar9;
  pointer pEVar10;
  EAM *this_00;
  long lVar12;
  char cVar13;
  Vector3d *v1;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined8 uVar30;
  RealType dvpdr;
  RealType phab;
  RealType rhb;
  RealType rha;
  CubicSplinePtr phi;
  RealType drhb;
  RealType drha;
  RealType dphb;
  RealType phb;
  RealType dpha;
  RealType pha;
  double local_148;
  RealType local_140;
  RealType local_138;
  double local_130;
  double local_128;
  pointer local_120;
  EAM *local_118;
  RealType local_110;
  RealType local_108;
  undefined1 local_100 [24];
  double local_e8;
  RealType local_e0;
  _Base_ptr local_d8;
  undefined1 *local_d0;
  _Base_ptr local_c8;
  RealType local_c0;
  pointer local_b8;
  pointer local_b0;
  undefined1 *local_a8;
  undefined8 uStack_a0;
  RealType local_98;
  undefined1 *local_90;
  RealType local_88;
  RealType local_80;
  undefined1 *local_78;
  undefined8 uStack_70;
  pointer local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  InteractionData *local_38;
  undefined8 *puVar11;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  dVar17 = idat->rij;
  if ((this->haveCutoffRadius_ == true) && (this->eamRcut_ <= dVar17 && dVar17 != this->eamRcut_)) {
    return;
  }
  piVar3 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar10 = (this->EAMdata).
            super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar12 = (long)piVar3[idat->atid1];
  local_e8 = (double)(long)piVar3[idat->atid2];
  local_118 = (EAM *)((long)local_e8 * 0x70);
  local_80 = pEVar10[lVar12].rcut;
  local_88 = pEVar10[(long)local_e8].rcut;
  local_d0 = (undefined1 *)(lVar12 * 0x18);
  local_130 = (double)((long)local_e8 * 0x40);
  local_128 = *(double *)
               (*(long *)(local_d0 +
                         (long)(this->MixingMap).
                               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x30 + (long)local_130);
  local_108 = 0.0;
  local_d8 = (_Base_ptr)0x0;
  local_110 = 0.0;
  local_e0 = 0.0;
  local_b0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  local_c0 = 0.0;
  local_c8 = (_Base_ptr)0x0;
  local_138 = 0.0;
  local_140 = 0.0;
  local_60 = pEVar10 + lVar12;
  t = &idat->rij;
  operator/((Vector<double,_3U> *)local_100,&(idat->d).super_Vector<double,_3U>,dVar17);
  v1 = &this->rhat;
  this_00 = (EAM *)v1;
  Vector3<double>::operator=(v1,(Vector<double,_3U> *)local_100);
  pEVar7 = local_60;
  dVar17 = idat->rij;
  uVar14 = SUB84(dVar17,0);
  uVar15 = (undefined4)((ulong)dVar17 >> 0x20);
  local_38 = idat;
  if ((dVar17 < local_80) && (dVar17 < local_128)) {
    local_120 = pEVar10;
    CubicSpline::getValueAndDerivativeAt
              ((local_60->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,t,&local_108,(RealType *)&local_d8);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar12 * 0x40 +
               *(long *)(local_d0 +
                        (long)(this->MixingMap).
                              super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)));
    CubicSpline::getValueAndDerivativeAt
              ((CubicSpline *)local_100._0_8_,t,(RealType *)&local_b0,(RealType *)&local_b8);
    this_00 = (EAM *)(local_100 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    uVar14 = SUB84(*t,0);
    uVar15 = (undefined4)((ulong)*t >> 0x20);
    pEVar10 = local_120;
  }
  pIVar8 = local_38;
  puVar11 = (undefined8 *)
            ((long)&(pEVar10->rho).
                    super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
            (long)local_118);
  local_118 = this;
  if (((double)CONCAT44(uVar15,uVar14) <= local_88 && local_88 != (double)CONCAT44(uVar15,uVar14))
     && ((double)CONCAT44(uVar15,uVar14) <= local_128 &&
         local_128 != (double)CONCAT44(uVar15,uVar14))) {
    CubicSpline::getValueAndDerivativeAt((CubicSpline *)*puVar11,t,&local_110,&local_e0);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)&(local_118->MixingMap).
                          super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)local_e8].
                          super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                          ._M_impl.super__Vector_impl_data + (long)local_130));
    CubicSpline::getValueAndDerivativeAt
              ((CubicSpline *)local_100._0_8_,t,&local_c0,(RealType *)&local_c8);
    this_00 = (EAM *)(local_100 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  bVar1 = pEVar7->isFluctuatingCharge;
  bVar2 = *(byte *)(puVar11 + 0xd);
  lVar12 = *(long *)(local_d0 +
                    (long)(local_118->MixingMap).
                          super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  cVar13 = *(char *)(lVar12 + 0x38 + (long)local_130);
  local_120 = (pointer)puVar11;
  if ((bVar1 == false) && ((bVar2 & 1) == 0)) {
    local_e8 = 0.0;
    if (*t <= local_128 && local_128 != *t) {
      std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
                 (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar12 + (long)local_130));
      CubicSpline::getValueAndDerivativeAt((CubicSpline *)local_100._0_8_,t,&local_138,&local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    }
    local_98 = 0.0;
    puVar28 = &DAT_3ff0000000000000;
    puVar29 = puVar28;
LAB_0022803e:
    local_130 = 0.0;
    local_148 = 0.0;
    pEVar10 = local_120;
    goto LAB_00228048;
  }
  if (bVar1 == false) {
    puVar28 = &DAT_3ff0000000000000;
    uStack_a0 = 0;
    local_e8 = 0.0;
    local_48 = 0.0;
    uStack_40 = 0;
  }
  else {
    local_e8 = pEVar7->nValence;
    local_48 = pEVar7->nMobile;
    uStack_40 = 0;
    if (local_118->mixMeth_ == eamDream2) {
      local_a8 = (undefined1 *)CONCAT71(local_a8._1_7_,cVar13);
      puVar28 = (undefined1 *)gFunc(this_00,pIVar8->flucQ1,local_e8,local_48);
      uStack_a0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      cVar13 = (char)local_a8;
    }
    else {
      uStack_a0 = 0;
      puVar28 = (undefined1 *)((local_e8 - pIVar8->flucQ1) / local_e8);
    }
  }
  local_a8 = puVar28;
  if ((bVar2 & 1) == 0) {
    EVar9 = local_118->mixMeth_;
    puVar29 = &DAT_3ff0000000000000;
    local_98 = 0.0;
    local_58 = 0.0;
LAB_00227ab6:
    uStack_50 = 0;
    uVar30 = 0;
    if ((EVar9 & ~eamDream1) == eamJohnson) {
      dVar17 = *t;
      if ((dVar17 < local_80) && (dVar17 < local_128)) {
        dVar16 = ((double)puVar29 / (double)puVar28) * 0.5;
        local_138 = dVar16 * (local_110 / local_108) * (double)local_b0 + local_138;
        auVar27._8_8_ = ((double)local_d8 * local_110) / local_108;
        auVar27._0_8_ = local_e0;
        auVar24._8_8_ = local_108;
        auVar24._0_8_ = local_108;
        auVar24 = divpd(auVar27,auVar24);
        local_140 = ((local_110 / local_108) * (double)local_b8 +
                    (auVar24._0_8_ - auVar24._8_8_) * (double)local_b0) * dVar16 + local_140;
        if (bVar1 != false) {
          pIVar8->dVdFQ1 =
               ((double)local_b0 * local_110 * (double)puVar29 * 0.5) /
               ((double)puVar28 * (double)puVar28 * local_108 * local_48) + pIVar8->dVdFQ1;
        }
        if ((bVar2 & 1) != 0) {
          pIVar8->dVdFQ2 =
               (local_110 * (double)local_b0 * -0.5) / (local_108 * local_58 * (double)puVar28) +
               pIVar8->dVdFQ2;
        }
      }
      local_130 = 0.0;
      if ((dVar17 < local_88) && (dVar17 < local_128)) {
        dVar17 = ((double)puVar28 / (double)puVar29) * 0.5;
        local_138 = dVar17 * (local_108 / local_110) * local_c0 + local_138;
        auVar26._8_8_ = (local_e0 * local_108) / local_110;
        auVar26._0_8_ = local_d8;
        auVar22._8_8_ = local_110;
        auVar22._0_8_ = local_110;
        auVar24 = divpd(auVar26,auVar22);
        local_140 = ((local_108 / local_110) * (double)local_c8 +
                    (auVar24._0_8_ - auVar24._8_8_) * local_c0) * dVar17 + local_140;
        if (bVar1 != false) {
          pIVar8->dVdFQ1 =
               (local_108 * local_c0 * -0.5) / (local_48 * local_110 * (double)puVar29) +
               pIVar8->dVdFQ1;
        }
        if ((bVar2 & 1) != 0) {
          pIVar8->dVdFQ2 =
               (local_c0 * local_108 * (double)puVar28 * 0.5) /
               ((double)puVar29 * (double)puVar29 * local_110 * local_58) + pIVar8->dVdFQ2;
        }
        local_148 = 0.0;
        pEVar10 = local_120;
        goto LAB_00228048;
      }
      goto LAB_0022803e;
    }
  }
  else {
    local_98 = *(RealType *)((long)local_120 + 0x58);
    local_58 = *(RealType *)((long)local_120 + 0x60);
    EVar9 = local_118->mixMeth_;
    uStack_50 = 0;
    if (EVar9 != eamDream2) {
      puVar29 = (undefined1 *)((local_98 - pIVar8->flucQ2) / local_98);
      goto LAB_00227ab6;
    }
    puVar29 = (undefined1 *)gFunc(this_00,pIVar8->flucQ2,local_98,local_58);
    uVar30 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
  }
  pEVar10 = local_120;
  dVar17 = *t;
  uVar14 = SUB84(dVar17,0);
  uVar15 = (undefined4)((ulong)dVar17 >> 0x20);
  local_78 = puVar29;
  uStack_70 = uVar30;
  if (cVar13 == '\0') {
    if ((dVar17 < local_80) && (dVar17 < local_128)) {
      std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
                 &(pEVar7->phiCC).
                  super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
      CubicSpline::getValueAndDerivativeAt
                ((CubicSpline *)local_100._0_8_,t,(RealType *)&local_b0,(RealType *)&local_b8);
      local_138 = (local_110 / local_108) * 0.5 * (double)local_b0 + local_138;
      auVar18._8_8_ = (local_110 * (double)local_d8) / local_108;
      auVar18._0_8_ = local_e0;
      auVar5._8_8_ = local_108;
      auVar5._0_8_ = local_108;
      auVar24 = divpd(auVar18,auVar5);
      local_140 = ((local_110 / local_108) * (double)local_b8 +
                  (auVar24._0_8_ - auVar24._8_8_) * (double)local_b0) * 0.5 + local_140;
      this_00 = (EAM *)(local_100 + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
      uVar14 = SUB84(*t,0);
      uVar15 = (undefined4)((ulong)*t >> 0x20);
    }
    local_d0 = &DAT_3ff0000000000000;
    if ((local_88 < (double)CONCAT44(uVar15,uVar14) || local_88 == (double)CONCAT44(uVar15,uVar14))
       || (local_128 < (double)CONCAT44(uVar15,uVar14) ||
           local_128 == (double)CONCAT44(uVar15,uVar14))) {
      uVar14 = 0;
      uVar15 = 0x3ff00000;
      goto LAB_0022822d;
    }
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)pEVar10 + 0x30));
    CubicSpline::getValueAndDerivativeAt
              ((CubicSpline *)local_100._0_8_,t,&local_c0,(RealType *)&local_c8);
    local_138 = (local_108 / local_110) * 0.5 * local_c0 + local_138;
    auVar19._8_8_ = (local_108 * local_e0) / local_110;
    auVar19._0_8_ = local_d8;
    auVar6._8_8_ = local_110;
    auVar6._0_8_ = local_110;
    auVar24 = divpd(auVar19,auVar6);
    local_140 = ((local_108 / local_110) * (double)local_c8 +
                (auVar24._0_8_ - auVar24._8_8_) * local_c0) * 0.5 + local_140;
    this_00 = (EAM *)(local_100 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    local_90 = &DAT_3ff0000000000000;
  }
  else {
    if (dVar17 < local_128) {
      std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
                 (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar12 + (long)local_130));
      CubicSpline::getValueAndDerivativeAt((CubicSpline *)local_100._0_8_,t,&local_138,&local_140);
      this_00 = (EAM *)(local_100 + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
      lVar12 = *(long *)(local_d0 +
                        (long)(local_118->MixingMap).
                              super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    }
    local_d0 = *(undefined1 **)(lVar12 + 0x20 + (long)local_130);
    uVar30 = *(undefined8 *)(lVar12 + 0x28 + (long)local_130);
    uVar14 = (undefined4)uVar30;
    uVar15 = (undefined4)((ulong)uVar30 >> 0x20);
    pEVar10 = local_120;
LAB_0022822d:
    local_90 = (undefined1 *)CONCAT44(uVar15,uVar14);
  }
  uVar14 = 0;
  uVar15 = 0;
  local_148 = 0.0;
  if (pEVar7->isFluctuatingCharge == true) {
    RVar4 = gPrime(this_00,pIVar8->flucQ1,local_e8,local_48);
    uVar14 = SUB84(RVar4,0);
    uVar15 = (undefined4)((ulong)RVar4 >> 0x20);
  }
  local_130 = (double)CONCAT44(uVar15,uVar14);
  if (*(char *)((long)pEVar10 + 0x68) == '\x01') {
    local_148 = gPrime(this_00,pIVar8->flucQ2,local_98,local_58);
  }
  dVar17 = *t;
  uVar14 = SUB84(dVar17,0);
  uVar15 = (undefined4)((ulong)dVar17 >> 0x20);
  if ((dVar17 < local_80) && (dVar17 < local_128)) {
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               &(pEVar7->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>)
    ;
    CubicSpline::getValueAndDerivativeAt
              ((CubicSpline *)local_100._0_8_,t,(RealType *)&local_b0,(RealType *)&local_b8);
    dVar16 = (double)local_78 * 0.5 * (double)local_d0;
    dVar17 = local_110 / local_108;
    auVar23._8_8_ = (local_110 * (double)local_d8) / local_108;
    auVar23._0_8_ = local_e0;
    auVar20._8_8_ = local_108;
    auVar20._0_8_ = local_108;
    auVar24 = divpd(auVar23,auVar20);
    local_138 = dVar16 * dVar17 * (double)local_b0 + local_138;
    local_140 = ((double)local_b8 * dVar17 + (auVar24._0_8_ - auVar24._8_8_) * (double)local_b0) *
                dVar16 + local_140;
    if (*(char *)((long)pEVar10 + 0x68) == '\x01') {
      pIVar8->dVdFQ2 =
           (double)local_d0 * local_148 * 0.5 * dVar17 * (double)local_b0 + pIVar8->dVdFQ2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    uVar14 = SUB84(*t,0);
    uVar15 = (undefined4)((ulong)*t >> 0x20);
  }
  puVar28 = local_a8;
  puVar29 = local_78;
  if (((double)CONCAT44(uVar15,uVar14) <= local_88 && local_88 != (double)CONCAT44(uVar15,uVar14))
     && ((double)CONCAT44(uVar15,uVar14) <= local_128 &&
         local_128 != (double)CONCAT44(uVar15,uVar14))) {
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)pEVar10 + 0x40));
    CubicSpline::getValueAndDerivativeAt
              ((CubicSpline *)local_100._0_8_,t,&local_c0,(RealType *)&local_c8);
    dVar16 = (double)local_a8 * 0.5 * (double)local_90;
    dVar17 = local_108 / local_110;
    auVar25._8_8_ = (local_108 * local_e0) / local_110;
    auVar25._0_8_ = local_d8;
    auVar21._8_8_ = local_110;
    auVar21._0_8_ = local_110;
    auVar24 = divpd(auVar25,auVar21);
    local_138 = dVar16 * dVar17 * local_c0 + local_138;
    local_140 = ((double)local_c8 * dVar17 + (auVar24._0_8_ - auVar24._8_8_) * local_c0) * dVar16 +
                local_140;
    if (pEVar7->isFluctuatingCharge == true) {
      pIVar8->dVdFQ1 = (double)local_90 * local_130 * 0.5 * dVar17 * local_c0 + pIVar8->dVdFQ1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    puVar28 = local_a8;
    puVar29 = local_78;
  }
LAB_00228048:
  operator*((Vector<double,_3U> *)local_100,&v1->super_Vector<double,_3U>,
            (double)puVar29 * local_e0 * pIVar8->dfrho1 +
            (double)puVar28 * (double)local_d8 * pIVar8->dfrho2 + local_140);
  Vector<double,_3U>::add(&(pIVar8->f1).super_Vector<double,_3U>,(Vector<double,_3U> *)local_100);
  pEVar7 = local_60;
  if (pIVar8->doParticlePot == true) {
    local_100._0_8_ = pIVar8->rho2 - local_108;
    RVar4 = CubicSpline::getValueAt(*(CubicSpline **)((long)pEVar10 + 0x10),(RealType *)local_100);
    pIVar8->particlePot1 = (RVar4 - pIVar8->frho2) + pIVar8->particlePot1;
    local_100._0_8_ = pIVar8->rho1 - local_110;
    RVar4 = CubicSpline::getValueAt
                      ((pEVar7->F).
                       super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (RealType *)local_100);
    pIVar8->particlePot2 = (RVar4 - pIVar8->frho1) + pIVar8->particlePot2;
  }
  (pIVar8->pot).data_[4] = (pIVar8->pot).data_[4] + local_138;
  if (pIVar8->isSelected == true) {
    (pIVar8->selePot).data_[4] = (pIVar8->selePot).data_[4] + local_138;
  }
  pIVar8->vpair = local_138 + pIVar8->vpair;
  if (pEVar7->isFluctuatingCharge == true) {
    dVar17 = pIVar8->dfrho2 * local_108;
    if (local_118->mixMeth_ == eamDream2) {
      pIVar8->dVdFQ1 = dVar17 * local_130 + pIVar8->dVdFQ1;
    }
    else {
      pIVar8->dVdFQ1 = pIVar8->dVdFQ1 - dVar17 / local_e8;
    }
  }
  if (*(char *)((long)pEVar10 + 0x68) == '\x01') {
    dVar17 = pIVar8->dfrho1 * local_110;
    if (local_118->mixMeth_ == eamDream2) {
      pIVar8->dVdFQ2 = dVar17 * local_148 + pIVar8->dVdFQ2;
    }
    else {
      pIVar8->dVdFQ2 = pIVar8->dVdFQ2 - dVar17 / local_98;
    }
  }
  return;
}

Assistant:

void EAM::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    int eamtid1        = EAMtids[idat.atid1];
    int eamtid2        = EAMtids[idat.atid2];
    EAMAtomData& data1 = EAMdata[eamtid1];
    EAMAtomData& data2 = EAMdata[eamtid2];

    // get type-specific cutoff radii

    RealType rci  = data1.rcut;
    RealType rcj  = data2.rcut;
    RealType rcij = MixingMap[eamtid1][eamtid2].rcut;

    RealType rha(0.0), drha(0.0), rhb(0.0), drhb(0.0);
    RealType pha(0.0), dpha(0.0), phb(0.0), dphb(0.0);

    RealType phab(0.0), dvpdr(0.0);
    RealType drhoidr(0.0), drhojdr(0.0), dudr(0.0);
    // For DREAM, we need nValence (Va, Vb), nMobile (Ma, Mb), for
    // each type, and density scaling variables (si, sj) for each atom:
    RealType Va(0.0), Vb(0.0);
    RealType Ma(0.0), Mb(0.0);
    RealType si(1.0), sj(1.0);
    RealType sip(0.0), sjp(0.0);
    RealType Ci(1.0), Cj(1.0);

    rhat = idat.d / idat.rij;
    if (idat.rij < rci && idat.rij < rcij) {
      data1.rho->getValueAndDerivativeAt(idat.rij, rha, drha);
      CubicSplinePtr phi = MixingMap[eamtid1][eamtid1].phi;
      phi->getValueAndDerivativeAt(idat.rij, pha, dpha);
    }

    if (idat.rij < rcj && idat.rij < rcij) {
      data2.rho->getValueAndDerivativeAt(idat.rij, rhb, drhb);
      CubicSplinePtr phi = MixingMap[eamtid2][eamtid2].phi;
      phi->getValueAndDerivativeAt(idat.rij, phb, dphb);
    }

    bool hasFlucQ   = data1.isFluctuatingCharge || data2.isFluctuatingCharge;
    bool isExplicit = MixingMap[eamtid1][eamtid2].explicitlySet;
    if (hasFlucQ) {
      if (data1.isFluctuatingCharge) {
        Va = data1.nValence;
        Ma = data1.nMobile;
        if (mixMeth_ == eamDream2)
          si = gFunc(idat.flucQ1, Va, Ma);
        else
          si = (Va - idat.flucQ1) / Va;
      }
      if (data2.isFluctuatingCharge) {
        Vb = data2.nValence;
        Mb = data2.nMobile;
        if (mixMeth_ == eamDream2)
          sj = gFunc(idat.flucQ2, Vb, Mb);
        else
          sj = (Vb - idat.flucQ2) / Vb;
      }

      if (mixMeth_ == eamJohnson || mixMeth_ == eamDream1) {
        if (idat.rij < rci && idat.rij < rcij) {
          phab  = phab + 0.5 * (sj / si) * (rhb / rha) * pha;
          dvpdr = dvpdr + 0.5 * (sj / si) *
                              ((rhb / rha) * dpha +
                               pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * (rhb * sj * pha) / (rha * Ma * si * si);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 -= 0.5 * (rhb * pha) / (rha * Mb * si);
          }
        }

        if (idat.rij < rcj && idat.rij < rcij) {
          phab  = phab + 0.5 * (si / sj) * (rha / rhb) * phb;
          dvpdr = dvpdr + 0.5 * (si / sj) *
                              ((rha / rhb) * dphb +
                               phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 -= 0.5 * (rha * phb) / (rhb * Ma * sj);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * (rha * si * phb) / (rhb * Mb * sj * sj);
          }
        }
      } else {
        if (isExplicit) {
          // phi is total potential for EAMTable and EAMZhou but CC interaction
          // for EAMOxide potential
          bool insideCutOff = (idat.rij < rcij);
          if (insideCutOff) {
            CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
            phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
          }

        } else {
          // Core-Core part first - no fluctuating charge, just Johnson mixing:

          if (idat.rij < rci && idat.rij < rcij) {
            CubicSplinePtr phiACC = data1.phiCC;
            phiACC->getValueAndDerivativeAt(idat.rij, pha, dpha);
            phab += 0.5 * (rhb / rha) * pha;
            dvpdr += 0.5 * ((rhb / rha) * dpha +
                            pha * ((drhb / rha) - (rhb * drha / rha / rha)));
          }
          if (idat.rij < rcj && idat.rij < rcij) {
            CubicSplinePtr phiBCC = data2.phiCC;
            phiBCC->getValueAndDerivativeAt(idat.rij, phb, dphb);
            phab += 0.5 * (rha / rhb) * phb;
            dvpdr += 0.5 * ((rha / rhb) * dphb +
                            phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));
          }
        }

        if (isExplicit) {
          // Ci, Cj are 0 for EAMTable and EAMZhou. So, there is no CV
          // interaction
          Ci = MixingMap[eamtid1][eamtid2].Ci;
          Cj = MixingMap[eamtid1][eamtid2].Cj;
        }
        // Core-Valence next, this does include fluctuating charges:

        if (data1.isFluctuatingCharge) { sip = gPrime(idat.flucQ1, Va, Ma); }
        if (data2.isFluctuatingCharge) { sjp = gPrime(idat.flucQ2, Vb, Mb); }

        if (idat.rij < rci && idat.rij < rcij) {
          CubicSplinePtr phiACV = data1.phiCV;
          phiACV->getValueAndDerivativeAt(idat.rij, pha, dpha);

          phab += 0.5 * sj * Ci * (rhb / rha) * pha;
          dvpdr += 0.5 * sj * Ci *
                   ((rhb / rha) * dpha +
                    pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * sjp * Ci * (rhb / rha) * pha;
          }
        }
        if (idat.rij < rcj && idat.rij < rcij) {
          CubicSplinePtr phiBCV = data2.phiCV;
          phiBCV->getValueAndDerivativeAt(idat.rij, phb, dphb);

          phab += 0.5 * si * Cj * (rha / rhb) * phb;
          dvpdr += 0.5 * si * Cj *
                   ((rha / rhb) * dphb +
                    phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * sip * Cj * (rha / rhb) * phb;
          }
        }
      }
    } else {
      if (idat.rij < rcij) {
        CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
        phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
      }
    }
    drhoidr = si * drha;
    drhojdr = sj * drhb;
    dudr    = drhojdr * idat.dfrho1 + drhoidr * idat.dfrho2 + dvpdr;

    idat.f1 += rhat * dudr;

    if (idat.doParticlePot) {
      // particlePot is the difference between the full potential and
      // the full potential without the presence of a particular
      // particle (atom1).
      //
      // This reduces the density at other particle locations, so we
      // need to recompute the density at atom2 assuming atom1 didn't
      // contribute.  This then requires recomputing the density
      // functional for atom2 as well.

      idat.particlePot1 += data2.F->getValueAt(idat.rho2 - rha) - idat.frho2;

      idat.particlePot2 += data1.F->getValueAt(idat.rho1 - rhb) - idat.frho1;
    }

    idat.pot[METALLIC_PAIR_FAMILY] += phab;
    if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += phab;

    idat.vpair += phab;

    // When densities are fluctuating, the functional depends on the
    // fluctuating densities from other sites:
    if (data1.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ1 += idat.dfrho2 * rha * sip;
      else
        idat.dVdFQ1 -= idat.dfrho2 * rha / Va;
    }
    if (data2.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ2 += idat.dfrho1 * rhb * sjp;
      else
        idat.dVdFQ2 -= idat.dfrho1 * rhb / Vb;
    }

    return;
  }